

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void warn(QPDF *qpdf,QPDFObjectHandle *node,string *msg)

{
  string local_40;
  string *local_20;
  string *msg_local;
  QPDFObjectHandle *node_local;
  QPDF *qpdf_local;
  
  local_20 = msg;
  msg_local = (string *)node;
  node_local = (QPDFObjectHandle *)qpdf;
  get_description_abi_cxx11_(&local_40,node);
  QPDF::warn(qpdf,qpdf_e_damaged_pdf,&local_40,0,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void
warn(QPDF& qpdf, QPDFObjectHandle& node, std::string const& msg)
{
    qpdf.warn(qpdf_e_damaged_pdf, get_description(node), 0, msg);
}